

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_done_sending(connectdata *conn,SingleRequest *k)

{
  CURLcode result;
  SingleRequest *k_local;
  connectdata *conn_local;
  
  k->keepon = k->keepon & 0xfffffffd;
  if (((*(ulong *)&(conn->bits).field_0x4 >> 0x12 & 1) == 0) ||
     (conn_local._4_4_ = Curl_readrewind(conn), conn_local._4_4_ == CURLE_OK)) {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_done_sending(struct connectdata *conn,
                           struct SingleRequest *k)
{
  k->keepon &= ~KEEP_SEND; /* we're done writing */

  /* These functions should be moved into the handler struct! */
  Curl_http2_done_sending(conn);
  Curl_quic_done_sending(conn);

  if(conn->bits.rewindaftersend) {
    CURLcode result = Curl_readrewind(conn);
    if(result)
      return result;
  }
  return CURLE_OK;
}